

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_get_extpri_stream_priority
              (nghttp2_session *session,nghttp2_extpri *extpri,int32_t stream_id)

{
  nghttp2_stream *pnVar1;
  int in_EDX;
  nghttp2_extpri *in_RSI;
  long in_RDI;
  nghttp2_stream *stream;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  if (*(char *)(in_RDI + 0xb74) == '\0') {
    local_4 = -0x207;
  }
  else if (*(char *)(in_RDI + 0xb72) == '\x01') {
    if (in_EDX == 0) {
      local_4 = -0x1f5;
    }
    else {
      pnVar1 = nghttp2_session_get_stream_raw
                         ((nghttp2_session *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                          (int32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
      if (pnVar1 == (nghttp2_stream *)0x0) {
        local_4 = -0x1f5;
      }
      else {
        nghttp2_extpri_from_uint8(in_RSI,pnVar1->extpri);
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nghttp2_session_get_extpri_stream_priority(nghttp2_session *session,
                                               nghttp2_extpri *extpri,
                                               int32_t stream_id) {
  nghttp2_stream *stream;

  if (!session->server) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  if (session->pending_no_rfc7540_priorities != 1) {
    return 0;
  }

  if (stream_id == 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  stream = nghttp2_session_get_stream_raw(session, stream_id);
  if (!stream) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  nghttp2_extpri_from_uint8(extpri, stream->extpri);

  return 0;
}